

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsics.cpp
# Opt level: O0

TestCaseGroup * vkt::sparse::createSparseResourcesShaderIntrinsicsTests(TestContext *testCtx)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  TestCaseGroup *pTVar4;
  char *pcVar5;
  ostream *poVar6;
  TestNode *pTVar7;
  TestNode *pTVar8;
  ImageType imageType_00;
  TextureFormat *format_00;
  string local_338;
  undefined1 local_311;
  string local_310;
  undefined1 local_2e9;
  string local_2e8;
  undefined1 local_2c1;
  string local_2c0;
  undefined1 local_299;
  string local_298;
  undefined4 local_274;
  ostringstream local_270 [8];
  ostringstream stream;
  undefined1 local_f4 [8];
  UVec3 imageSize;
  deInt32 imageSizeNdx;
  undefined1 local_c0 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatGroup;
  TextureFormat *format;
  deInt32 formatNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageTypeGroup;
  ImageType imageType;
  deInt32 imageTypeNdx;
  SpirVFunction function;
  deUint32 functionNdx;
  string *local_38;
  DefaultDeleter<tcu::TestCaseGroup> local_2d [13];
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  TestContext *testCtx_local;
  
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = testCtx;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(TestContext *)
                    testGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"shader_intrinsics","Sparse Resources Shader Intrinsics");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_2d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  if ((createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::imageParametersArray == '\0')
     && (iVar2 = __cxa_guard_acquire(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)
                                      ::imageParametersArray), iVar2 != 0)) {
    createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageType = IMAGE_TYPE_2D;
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes,0x200,
               0x100,1);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes + 1,
               0x80,0x80,1);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes + 2,
               0x1f7,0x89,1);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[0].imageSizes + 3,
               0xb,0x25,1);
    createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageType =
         IMAGE_TYPE_2D_ARRAY;
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes,0x200,
               0x100,6);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes + 1,
               0x80,0x80,8);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes + 2,
               0x1f7,0x89,3);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[1].imageSizes + 3,
               0xb,0x25,3);
    createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageType = IMAGE_TYPE_CUBE;
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes,0x100,
               0x100,1);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes + 1,
               0x80,0x80,1);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes + 2,
               0x89,0x89,1);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[2].imageSizes + 3,
               0xb,0xb,1);
    createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageType =
         IMAGE_TYPE_CUBE_ARRAY;
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes,0x100,
               0x100,6);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes + 1,
               0x80,0x80,8);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes + 2,
               0x89,0x89,3);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[3].imageSizes + 3,
               0xb,0xb,3);
    createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageType = IMAGE_TYPE_3D;
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes,0x100,
               0x100,0x10);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes + 1,
               0x80,0x80,8);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes + 2,
               0x1f7,0x89,3);
    tcu::Vector<unsigned_int,_3>::Vector
              (createSparseResourcesShaderIntrinsicsTests::imageParametersArray[4].imageSizes + 3,
               0xb,0x25,3);
    __cxa_guard_release(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                         imageParametersArray);
  }
  if ((createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::formats == '\0') &&
     (iVar2 = __cxa_guard_acquire(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                                   formats), iVar2 != 0)) {
    tcu::TextureFormat::TextureFormat
              (createSparseResourcesShaderIntrinsicsTests::formats,R,SIGNED_INT32);
    tcu::TextureFormat::TextureFormat
              (createSparseResourcesShaderIntrinsicsTests::formats + 1,R,SIGNED_INT16);
    tcu::TextureFormat::TextureFormat
              (createSparseResourcesShaderIntrinsicsTests::formats + 2,R,SIGNED_INT8);
    tcu::TextureFormat::TextureFormat
              (createSparseResourcesShaderIntrinsicsTests::formats + 3,RGBA,UNSIGNED_INT32);
    tcu::TextureFormat::TextureFormat
              (createSparseResourcesShaderIntrinsicsTests::formats + 4,RGBA,UNSIGNED_INT16);
    tcu::TextureFormat::TextureFormat
              (createSparseResourcesShaderIntrinsicsTests::formats + 5,RGBA,UNSIGNED_INT8);
    __cxa_guard_release(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::formats);
  }
  if ((createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_ == '\0')
     && (iVar2 = __cxa_guard_acquire(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)
                                      ::functions_abi_cxx11_), iVar2 != 0)) {
    function._2_1_ = 1;
    local_38 = createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_,
               "_sparse_fetch",(allocator<char> *)((long)&functionNdx + 3));
    local_38 = (string *)0x16f63a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
               + 1),"_sparse_read",(allocator<char> *)((long)&functionNdx + 2));
    local_38 = (string *)0x16f63c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
               + 2),"_sparse_sample_explicit_lod",(allocator<char> *)((long)&functionNdx + 1));
    local_38 = (string *)0x16f63e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
               + 3),"_sparse_sample_implicit_lod",(allocator<char> *)&functionNdx);
    local_38 = (string *)0x16f6400;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               (createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::functions_abi_cxx11_
               + 4),"_sparse_gather",(allocator<char> *)((long)&function + 3));
    function._2_1_ = SPARSE_FETCH >> 0x10;
    std::allocator<char>::~allocator((allocator<char> *)((long)&function + 3));
    std::allocator<char>::~allocator((allocator<char> *)&functionNdx);
    std::allocator<char>::~allocator((allocator<char> *)((long)&functionNdx + 1));
    std::allocator<char>::~allocator((allocator<char> *)((long)&functionNdx + 2));
    std::allocator<char>::~allocator((allocator<char> *)((long)&functionNdx + 3));
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                         functions_abi_cxx11_);
  }
  imageTypeNdx = 0;
  do {
    if (4 < (uint)imageTypeNdx) {
      pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
               release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20);
      local_274 = 1;
      de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
      return pTVar4;
    }
    for (imageTypeGroup.
         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._12_4_
              = 0;
        (int)imageTypeGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             _12_4_ < 5;
        imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
        .m_data._12_4_ =
             imageTypeGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             _12_4_ + 1) {
      imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._8_4_ = createSparseResourcesShaderIntrinsicsTests::imageParametersArray
                     [(int)imageTypeGroup.
                           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                           .m_data._12_4_].imageType;
      pTVar4 = (TestCaseGroup *)operator_new(0x70);
      uVar1 = testGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              _8_8_;
      format._7_1_ = 1;
      getImageTypeName_abi_cxx11_
                ((string *)&formatNdx,
                 (sparse *)
                 (ulong)(uint)imageTypeGroup.
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              .m_data._8_4_,imageType_00);
      std::operator+(&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&formatNdx
                     ,createSparseResourcesShaderIntrinsicsTests(tcu::TestContext&)::
                      functions_abi_cxx11_ + (uint)imageTypeNdx);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      tcu::TestCaseGroup::TestCaseGroup(pTVar4,(TestContext *)uVar1,pcVar5,"");
      format._7_1_ = 0;
      de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
                ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&format + 6));
      de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_60,
                 pTVar4);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&formatNdx);
      for (format._0_4_ = 0; (int)format < 6; format._0_4_ = (int)format + 1) {
        formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data._8_8_ = createSparseResourcesShaderIntrinsicsTests::formats + (int)format;
        pTVar4 = (TestCaseGroup *)operator_new(0x70);
        uVar1 = testGroup.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                ._8_8_;
        imageSize.m_data[2]._3_1_ = 1;
        getShaderImageFormatQualifier_abi_cxx11_
                  ((string *)&imageSizeNdx,
                   (sparse *)
                   formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data._8_8_,format_00);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        tcu::TestCaseGroup::TestCaseGroup(pTVar4,(TestContext *)uVar1,pcVar5,"");
        imageSize.m_data[2]._3_1_ = 0;
        de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
                  ((DefaultDeleter<tcu::TestCaseGroup> *)((long)imageSize.m_data + 10));
        de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
                  ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_c0,
                   pTVar4);
        std::__cxx11::string::~string((string *)&imageSizeNdx);
        for (imageSize.m_data[1] = 0; (int)imageSize.m_data[1] < 4;
            imageSize.m_data[1] = imageSize.m_data[1] + 1) {
          tcu::Vector<unsigned_int,_3>::Vector
                    ((Vector<unsigned_int,_3> *)local_f4,
                     (Vector<unsigned_int,_3> *)
                     ((long)(int)imageTypeGroup.
                                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                 .m_data._12_4_ * 0x34 + 0x16f6234 +
                     (long)(int)imageSize.m_data[1] * 0xc));
          std::__cxx11::ostringstream::ostringstream(local_270);
          uVar3 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_f4);
          poVar6 = (ostream *)std::ostream::operator<<(local_270,uVar3);
          poVar6 = std::operator<<(poVar6,"_");
          uVar3 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_f4);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
          poVar6 = std::operator<<(poVar6,"_");
          uVar3 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_f4);
          std::ostream::operator<<(poVar6,uVar3);
          if (imageTypeNdx == 0) {
            if ((imageTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data._8_4_ != 5) &&
               (imageTypeGroup.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                ._8_4_ != 6)) goto LAB_00da7b75;
            local_274 = 0xd;
          }
          else {
            if (imageTypeNdx - 2U < 3) {
LAB_00da7b75:
              if (((imageTypeGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_4_ == 5) ||
                  (imageTypeGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data._8_4_ == 6)) ||
                 (imageTypeGroup.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data._8_4_ == 4)) {
                local_274 = 0xd;
                goto LAB_00da80a3;
              }
            }
            switch(imageTypeNdx) {
            case 0:
              pTVar7 = &de::details::
                        UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                        operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                    *)local_c0)->super_TestNode;
              pTVar8 = (TestNode *)operator_new(0x90);
              uVar1 = testGroup.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_;
              local_299 = 1;
              std::__cxx11::ostringstream::str();
              SparseCaseOpImageSparseFetch::SparseCaseOpImageSparseFetch
                        ((SparseCaseOpImageSparseFetch *)pTVar8,(TestContext *)uVar1,&local_298,
                         imageTypeNdx,
                         imageTypeGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_4_,(UVec3 *)local_f4,
                         (TextureFormat *)
                         formatGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_8_);
              local_299 = 0;
              tcu::TestNode::addChild(pTVar7,pTVar8);
              std::__cxx11::string::~string((string *)&local_298);
              break;
            case 1:
              pTVar7 = &de::details::
                        UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                        operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                    *)local_c0)->super_TestNode;
              pTVar8 = (TestNode *)operator_new(0x90);
              uVar1 = testGroup.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_;
              local_2c1 = 1;
              std::__cxx11::ostringstream::str();
              SparseCaseOpImageSparseRead::SparseCaseOpImageSparseRead
                        ((SparseCaseOpImageSparseRead *)pTVar8,(TestContext *)uVar1,&local_2c0,
                         imageTypeNdx,
                         imageTypeGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_4_,(UVec3 *)local_f4,
                         (TextureFormat *)
                         formatGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_8_);
              local_2c1 = 0;
              tcu::TestNode::addChild(pTVar7,pTVar8);
              std::__cxx11::string::~string((string *)&local_2c0);
              break;
            case 2:
              pTVar7 = &de::details::
                        UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                        operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                    *)local_c0)->super_TestNode;
              pTVar8 = (TestNode *)operator_new(0x90);
              uVar1 = testGroup.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_;
              local_2e9 = 1;
              std::__cxx11::ostringstream::str();
              SparseCaseOpImageSparseSampleExplicitLod::SparseCaseOpImageSparseSampleExplicitLod
                        ((SparseCaseOpImageSparseSampleExplicitLod *)pTVar8,(TestContext *)uVar1,
                         &local_2e8,imageTypeNdx,
                         imageTypeGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_4_,(UVec3 *)local_f4,
                         (TextureFormat *)
                         formatGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_8_);
              local_2e9 = 0;
              tcu::TestNode::addChild(pTVar7,pTVar8);
              std::__cxx11::string::~string((string *)&local_2e8);
              break;
            case 3:
              pTVar7 = &de::details::
                        UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                        operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                    *)local_c0)->super_TestNode;
              pTVar8 = (TestNode *)operator_new(0x90);
              uVar1 = testGroup.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_;
              local_311 = 1;
              std::__cxx11::ostringstream::str();
              SparseCaseOpImageSparseSampleImplicitLod::SparseCaseOpImageSparseSampleImplicitLod
                        ((SparseCaseOpImageSparseSampleImplicitLod *)pTVar8,(TestContext *)uVar1,
                         &local_310,imageTypeNdx,
                         imageTypeGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_4_,(UVec3 *)local_f4,
                         (TextureFormat *)
                         formatGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_8_);
              local_311 = 0;
              tcu::TestNode::addChild(pTVar7,pTVar8);
              std::__cxx11::string::~string((string *)&local_310);
              break;
            case 4:
              pTVar7 = &de::details::
                        UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                        operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                    *)local_c0)->super_TestNode;
              pTVar8 = (TestNode *)operator_new(0x90);
              uVar1 = testGroup.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_;
              std::__cxx11::ostringstream::str();
              SparseCaseOpImageSparseGather::SparseCaseOpImageSparseGather
                        ((SparseCaseOpImageSparseGather *)pTVar8,(TestContext *)uVar1,&local_338,
                         imageTypeNdx,
                         imageTypeGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_4_,(UVec3 *)local_f4,
                         (TextureFormat *)
                         formatGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_8_);
              tcu::TestNode::addChild(pTVar7,pTVar8);
              std::__cxx11::string::~string((string *)&local_338);
            }
            local_274 = 0;
          }
LAB_00da80a3:
          std::__cxx11::ostringstream::~ostringstream(local_270);
        }
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_60)->super_TestNode;
        pTVar8 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                  ::release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                            local_c0)->super_TestNode;
        tcu::TestNode::addChild(pTVar7,pTVar8);
        de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
                  ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_c0)
        ;
      }
      pTVar7 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                ::operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_20)->super_TestNode;
      pTVar8 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                        local_60)->super_TestNode;
      tcu::TestNode::addChild(pTVar7,pTVar8);
      de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_60);
    }
    imageTypeNdx = imageTypeNdx + 1;
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createSparseResourcesShaderIntrinsicsTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "shader_intrinsics", "Sparse Resources Shader Intrinsics"));

	static const deUint32 sizeCountPerImageType = 4u;

	struct ImageParameters
	{
		ImageType	imageType;
		tcu::UVec3	imageSizes[sizeCountPerImageType];
	};

	static const ImageParameters imageParametersArray[] =
	{
		{ IMAGE_TYPE_2D,		{ tcu::UVec3(512u, 256u, 1u),	tcu::UVec3(128u, 128u, 1u), tcu::UVec3(503u, 137u, 1u), tcu::UVec3(11u, 37u, 1u) } },
		{ IMAGE_TYPE_2D_ARRAY,	{ tcu::UVec3(512u, 256u, 6u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(503u, 137u, 3u),	tcu::UVec3(11u, 37u, 3u) } },
		{ IMAGE_TYPE_CUBE,		{ tcu::UVec3(256u, 256u, 1u),	tcu::UVec3(128u, 128u, 1u),	tcu::UVec3(137u, 137u, 1u),	tcu::UVec3(11u, 11u, 1u) } },
		{ IMAGE_TYPE_CUBE_ARRAY,{ tcu::UVec3(256u, 256u, 6u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(137u, 137u, 3u),	tcu::UVec3(11u, 11u, 3u) } },
		{ IMAGE_TYPE_3D,		{ tcu::UVec3(256u, 256u, 16u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(503u, 137u, 3u),	tcu::UVec3(11u, 37u, 3u) } }
	};

	static const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT8)
	};

	static const std::string functions[SPARSE_SPIRV_FUNCTION_TYPE_LAST] =
	{
		"_sparse_fetch",
		"_sparse_read",
		"_sparse_sample_explicit_lod",
		"_sparse_sample_implicit_lod",
		"_sparse_gather",
	};

	for (deUint32 functionNdx = 0; functionNdx < SPARSE_SPIRV_FUNCTION_TYPE_LAST; ++functionNdx)
	{
		const SpirVFunction function = static_cast<SpirVFunction>(functionNdx);

		for (deInt32 imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray); ++imageTypeNdx)
		{
			const ImageType					imageType = imageParametersArray[imageTypeNdx].imageType;
			de::MovePtr<tcu::TestCaseGroup> imageTypeGroup(new tcu::TestCaseGroup(testCtx, (getImageTypeName(imageType) + functions[functionNdx]).c_str(), ""));

			for (deInt32 formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); ++formatNdx)
			{
				const tcu::TextureFormat&		format = formats[formatNdx];
				de::MovePtr<tcu::TestCaseGroup> formatGroup(new tcu::TestCaseGroup(testCtx, getShaderImageFormatQualifier(format).c_str(), ""));

				for (deInt32 imageSizeNdx = 0; imageSizeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray[imageTypeNdx].imageSizes); ++imageSizeNdx)
				{
					const tcu::UVec3 imageSize = imageParametersArray[imageTypeNdx].imageSizes[imageSizeNdx];

					std::ostringstream stream;
					stream << imageSize.x() << "_" << imageSize.y() << "_" << imageSize.z();

					switch (function)
					{
					case SPARSE_FETCH:
						if ((imageType == IMAGE_TYPE_CUBE) || (imageType == IMAGE_TYPE_CUBE_ARRAY)) continue;
					case SPARSE_SAMPLE_EXPLICIT_LOD:
					case SPARSE_SAMPLE_IMPLICIT_LOD:
					case SPARSE_GATHER:
						if ((imageType == IMAGE_TYPE_CUBE) || (imageType == IMAGE_TYPE_CUBE_ARRAY) || (imageType == IMAGE_TYPE_3D)) continue;
						break;
					default:
						break;
					}

					switch (function)
					{
					case SPARSE_FETCH:
						formatGroup->addChild(new SparseCaseOpImageSparseFetch(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_READ:
						formatGroup->addChild(new SparseCaseOpImageSparseRead(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_SAMPLE_EXPLICIT_LOD:
						formatGroup->addChild(new SparseCaseOpImageSparseSampleExplicitLod(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_SAMPLE_IMPLICIT_LOD:
						formatGroup->addChild(new SparseCaseOpImageSparseSampleImplicitLod(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					case SPARSE_GATHER:
						formatGroup->addChild(new SparseCaseOpImageSparseGather(testCtx, stream.str(), function, imageType, imageSize, format));
						break;
					default:
						DE_ASSERT(0);
						break;
					}
				}
				imageTypeGroup->addChild(formatGroup.release());
			}
			testGroup->addChild(imageTypeGroup.release());
		}
	}

	return testGroup.release();
}